

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void resetAccumulator(Parse *pParse,AggInfo *pAggInfo)

{
  Vdbe *p;
  Expr *pEVar1;
  ExprList *pList;
  int iVar2;
  KeyInfo *pKVar3;
  uint local_5c;
  int nExtra;
  KeyInfo *pKeyInfo_1;
  ExprList *pOBList;
  KeyInfo *pKeyInfo;
  Expr *pE;
  AggInfo_func *pAStack_30;
  int nReg;
  AggInfo_func *pFunc;
  int i;
  Vdbe *v;
  AggInfo *pAggInfo_local;
  Parse *pParse_local;
  
  p = pParse->pVdbe;
  iVar2 = pAggInfo->nFunc + pAggInfo->nColumn;
  if ((iVar2 != 0) && (pParse->nErr == 0)) {
    sqlite3VdbeAddOp3(p,0x4b,0,pAggInfo->iFirstReg,pAggInfo->iFirstReg + iVar2 + -1);
    pAStack_30 = pAggInfo->aFunc;
    for (pFunc._4_4_ = 0; pFunc._4_4_ < pAggInfo->nFunc; pFunc._4_4_ = pFunc._4_4_ + 1) {
      if (-1 < pAStack_30->iDistinct) {
        pEVar1 = pAStack_30->pFExpr;
        if (((pEVar1->x).pList == (ExprList *)0x0) || (((pEVar1->x).pList)->nExpr != 1)) {
          sqlite3ErrorMsg(pParse,"DISTINCT aggregates must have exactly one argument");
          pAStack_30->iDistinct = -1;
        }
        else {
          pKVar3 = sqlite3KeyInfoFromExprList(pParse,(pEVar1->x).pList,0,0);
          iVar2 = sqlite3VdbeAddOp4(p,0x76,pAStack_30->iDistinct,0,0,(char *)pKVar3,-8);
          pAStack_30->iDistAddr = iVar2;
          sqlite3VdbeExplain(pParse,'\0',"USE TEMP B-TREE FOR %s(DISTINCT)",pAStack_30->pFunc->zName
                            );
        }
      }
      if (-1 < pAStack_30->iOBTab) {
        pList = (pAStack_30->pFExpr->pLeft->x).pList;
        local_5c = (uint)(pAStack_30->bOBUnique == '\0');
        if (pAStack_30->bOBPayload != '\0') {
          local_5c = ((pAStack_30->pFExpr->x).pList)->nExpr + local_5c;
        }
        if (pAStack_30->bUseSubtype != '\0') {
          local_5c = ((pAStack_30->pFExpr->x).pList)->nExpr + local_5c;
        }
        pKVar3 = sqlite3KeyInfoFromExprList(pParse,pList,0,local_5c);
        if ((pAStack_30->bOBUnique == '\0') && (pParse->nErr == 0)) {
          pKVar3->nKeyField = pKVar3->nKeyField + 1;
        }
        sqlite3VdbeAddOp4(p,0x76,pAStack_30->iOBTab,pList->nExpr + local_5c,0,(char *)pKVar3,-8);
        sqlite3VdbeExplain(pParse,'\0',"USE TEMP B-TREE FOR %s(ORDER BY)",pAStack_30->pFunc->zName);
      }
      pAStack_30 = pAStack_30 + 1;
    }
  }
  return;
}

Assistant:

static void resetAccumulator(Parse *pParse, AggInfo *pAggInfo){
  Vdbe *v = pParse->pVdbe;
  int i;
  struct AggInfo_func *pFunc;
  int nReg = pAggInfo->nFunc + pAggInfo->nColumn;
  assert( pAggInfo->iFirstReg>0 );
  assert( pParse->db->pParse==pParse );
  assert( pParse->db->mallocFailed==0 || pParse->nErr!=0 );
  if( nReg==0 ) return;
  if( pParse->nErr ) return;
  sqlite3VdbeAddOp3(v, OP_Null, 0, pAggInfo->iFirstReg,
                    pAggInfo->iFirstReg+nReg-1);
  for(pFunc=pAggInfo->aFunc, i=0; i<pAggInfo->nFunc; i++, pFunc++){
    if( pFunc->iDistinct>=0 ){
      Expr *pE = pFunc->pFExpr;
      assert( ExprUseXList(pE) );
      if( pE->x.pList==0 || pE->x.pList->nExpr!=1 ){
        sqlite3ErrorMsg(pParse, "DISTINCT aggregates must have exactly one "
           "argument");
        pFunc->iDistinct = -1;
      }else{
        KeyInfo *pKeyInfo = sqlite3KeyInfoFromExprList(pParse, pE->x.pList,0,0);
        pFunc->iDistAddr = sqlite3VdbeAddOp4(v, OP_OpenEphemeral,
            pFunc->iDistinct, 0, 0, (char*)pKeyInfo, P4_KEYINFO);
        ExplainQueryPlan((pParse, 0, "USE TEMP B-TREE FOR %s(DISTINCT)",
                          pFunc->pFunc->zName));
      }
    }
    if( pFunc->iOBTab>=0 ){
      ExprList *pOBList;
      KeyInfo *pKeyInfo;
      int nExtra = 0;
      assert( pFunc->pFExpr->pLeft!=0 );
      assert( pFunc->pFExpr->pLeft->op==TK_ORDER );
      assert( ExprUseXList(pFunc->pFExpr->pLeft) );
      assert( pFunc->pFunc!=0 );
      pOBList = pFunc->pFExpr->pLeft->x.pList;
      if( !pFunc->bOBUnique ){
        nExtra++;  /* One extra column for the OP_Sequence */
      }
      if( pFunc->bOBPayload ){
        /* extra columns for the function arguments */
        assert( ExprUseXList(pFunc->pFExpr) );
        nExtra += pFunc->pFExpr->x.pList->nExpr;
      }
      if( pFunc->bUseSubtype ){
        nExtra += pFunc->pFExpr->x.pList->nExpr;
      }
      pKeyInfo = sqlite3KeyInfoFromExprList(pParse, pOBList, 0, nExtra);
      if( !pFunc->bOBUnique && pParse->nErr==0 ){
        pKeyInfo->nKeyField++;
      }
      sqlite3VdbeAddOp4(v, OP_OpenEphemeral,
            pFunc->iOBTab, pOBList->nExpr+nExtra, 0,
            (char*)pKeyInfo, P4_KEYINFO);
      ExplainQueryPlan((pParse, 0, "USE TEMP B-TREE FOR %s(ORDER BY)",
                          pFunc->pFunc->zName));
    }
  }
}